

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void dxil_spv::Converter::Impl::get_shader_model
               (Module *module,String *model,uint32_t *major,uint32_t *minor)

{
  uint uVar1;
  NamedMDNode *this;
  String local_80;
  MDNode *local_60;
  MDNode *meta;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  NamedMDNode *local_30;
  NamedMDNode *resource_meta;
  uint32_t *minor_local;
  uint32_t *major_local;
  String *model_local;
  Module *module_local;
  
  resource_meta = (NamedMDNode *)minor;
  minor_local = major;
  major_local = (uint32_t *)model;
  model_local = (String *)module;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_50,"dx.shaderModel",(ThreadLocalAllocator<char> *)((long)&meta + 7));
  uVar1 = (uint)minor;
  this = LLVMBC::Module::getNamedMetadata(module,&local_50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string(&local_50);
  local_30 = this;
  if (this == (NamedMDNode *)0x0) {
    if (minor_local != (uint32_t *)0x0) {
      *minor_local = 6;
    }
    if (resource_meta != (NamedMDNode *)0x0) {
      *(undefined4 *)&(resource_meta->super_MDOperand).parent = 0;
    }
    if (major_local != (uint32_t *)0x0) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)major_local);
    }
  }
  else {
    local_60 = LLVMBC::NamedMDNode::getOperand(this,0);
    if (major_local != (uint32_t *)0x0) {
      get_string_metadata_abi_cxx11_(&local_80,(dxil_spv *)local_60,(MDNode *)0x0,uVar1);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)major_local,&local_80);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
      ~basic_string(&local_80);
    }
    if (minor_local != (uint32_t *)0x0) {
      uVar1 = get_constant_metadata<unsigned_int>(local_60,1);
      *minor_local = uVar1;
    }
    if (resource_meta != (NamedMDNode *)0x0) {
      uVar1 = get_constant_metadata<unsigned_int>(local_60,2);
      *(uint *)&(resource_meta->super_MDOperand).parent = uVar1;
    }
  }
  return;
}

Assistant:

void Converter::Impl::get_shader_model(const llvm::Module &module, String *model, uint32_t *major, uint32_t *minor)
{
	auto *resource_meta = module.getNamedMetadata("dx.shaderModel");
	if (!resource_meta)
	{
		if (major)
			*major = 6;
		if (minor)
			*minor = 0;
		if (model)
			model->clear();
	}
	else
	{
		auto *meta = resource_meta->getOperand(0);

		if (model)
			*model = get_string_metadata(meta, 0);
		if (major)
			*major = get_constant_metadata(meta, 1);
		if (minor)
			*minor = get_constant_metadata(meta, 2);
	}
}